

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall cmCTestTestHandler::GenerateDartOutput(cmCTestTestHandler *this,cmXMLWriter *xml)

{
  cmCTest *this_00;
  cmXMLWriter *pcVar1;
  bool bVar2;
  char *cfname;
  ulong uVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  duration<long,_std::ratio<60L,_1L>_> local_560;
  rep local_558;
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  reference local_438;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *measure;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  char *local_2d8;
  char *reasonType;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  reference local_190;
  cmCTestTestResult *result_1;
  iterator __end1_1;
  iterator __begin1_1;
  TestResultsVector *__range1_1;
  allocator<char> local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string testPath;
  cmCTestTestResult *result;
  iterator __end1;
  iterator __begin1;
  TestResultsVector *__range1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  cmCTestTestHandler *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  bVar2 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar2) {
    cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,local_18,
                      (bool)((this->super_cmCTestGenericHandler).AppendXML & 1));
    cmCTest::GenerateSubprojectsOutput((this->super_cmCTestGenericHandler).CTest,local_18);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Testing",&local_39);
    cmXMLWriter::StartElement(pcVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"StartDateTime",&local_71);
    cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_70,&this->StartTest);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"StartTestTime",&local_99);
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (pcVar1,&local_98,&this->StartTestTime);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"TestList",(allocator<char> *)((long)&__range1 + 7));
    cmXMLWriter::StartElement(pcVar1,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    __end1 = std::
             vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ::begin(&this->TestResults);
    result = (cmCTestTestResult *)
             std::
             vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ::end(&this->TestResults);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                                       *)&result), bVar2) {
      testPath.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
           ::operator*(&__end1);
      std::operator+(&local_128,&((reference)testPath.field_2._8_8_)->Path,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                     &local_128,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     testPath.field_2._8_8_);
      std::__cxx11::string::~string((string *)&local_128);
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Test",&local_149);
      this_00 = (this->super_cmCTestGenericHandler).CTest;
      cfname = (char *)std::__cxx11::string::c_str();
      cmCTest::GetShortPathToFile_abi_cxx11_((string *)&__range1_1,this_00,cfname);
      cmXMLWriter::Element<std::__cxx11::string>
                (pcVar1,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1);
      std::__cxx11::string::~string((string *)&__range1_1);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      std::__cxx11::string::~string((string *)local_108);
      __gnu_cxx::
      __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
      ::operator++(&__end1);
    }
    cmXMLWriter::EndElement(local_18);
    __end1_1 = std::
               vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ::begin(&this->TestResults);
    result_1 = (cmCTestTestResult *)
               std::
               vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ::end(&this->TestResults);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                               *)&result_1), pcVar1 = local_18, bVar2) {
      local_190 = __gnu_cxx::
                  __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
                  ::operator*(&__end1_1);
      WriteTestResultHeader(this,local_18,local_190);
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"Results",&local_1b1);
      cmXMLWriter::StartElement(pcVar1,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      pcVar1 = local_18;
      if (local_190->Status != 0) {
        if ((local_190->Status != 9) || (local_190->ReturnValue != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"NamedMeasurement",&local_1d9);
          cmXMLWriter::StartElement(pcVar1,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
          cmXMLWriter::Attribute<char[12]>(local_18,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<char[10]>(local_18,"name",(char (*) [10])"Exit Code");
          pcVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_200,"Value",&local_201);
          GetTestStatus_abi_cxx11_(&local_228,this,local_190);
          cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_200,&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator(&local_201);
          cmXMLWriter::EndElement(local_18);
          pcVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_248,"NamedMeasurement",&local_249);
          cmXMLWriter::StartElement(pcVar1,&local_248);
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          cmXMLWriter::Attribute<char[12]>(local_18,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<char[11]>(local_18,"name",(char (*) [11])"Exit Value");
          pcVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"Value",&local_271);
          cmXMLWriter::Element<long>(pcVar1,&local_270,&local_190->ReturnValue);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
          cmXMLWriter::EndElement(local_18);
        }
        GenerateRegressionImages(this,local_18,&local_190->DartString);
        pcVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"NamedMeasurement",&local_299);
        cmXMLWriter::StartElement(pcVar1,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator(&local_299);
        cmXMLWriter::Attribute<char[15]>(local_18,"type",(char (*) [15])"numeric/double");
        cmXMLWriter::Attribute<char[15]>(local_18,"name",(char (*) [15])"Execution Time");
        pcVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Value",&local_2c1);
        reasonType = (char *)std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                                       (&local_190->ExecutionTime);
        cmXMLWriter::Element<double>(pcVar1,&local_2c0,(double *)&reasonType);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::allocator<char>::~allocator(&local_2c1);
        cmXMLWriter::EndElement(local_18);
        uVar3 = std::__cxx11::string::empty();
        pcVar1 = local_18;
        if ((uVar3 & 1) == 0) {
          local_2d8 = "Test Pass Reason";
          if (local_190->Status != 9) {
            local_2d8 = "Test Fail Reason";
          }
          local_2d8 = local_2d8 + 5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8,"NamedMeasurement",&local_2f9);
          cmXMLWriter::StartElement(pcVar1,&local_2f8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::allocator<char>::~allocator(&local_2f9);
          cmXMLWriter::Attribute<char[12]>(local_18,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<char_const*>(local_18,"name",&local_2d8);
          pcVar1 = local_18;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_320,"Value",&local_321);
          cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_320,&local_190->Reason);
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator(&local_321);
          cmXMLWriter::EndElement(local_18);
        }
      }
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,"NamedMeasurement",&local_349);
      cmXMLWriter::StartElement(pcVar1,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::allocator<char>::~allocator(&local_349);
      cmXMLWriter::Attribute<char[15]>(local_18,"type",(char (*) [15])"numeric/double");
      cmXMLWriter::Attribute<char[11]>(local_18,"name",(char (*) [11])"Processors");
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"Value",&local_371);
      cmXMLWriter::Element<int>(pcVar1,&local_370,&local_190->Properties->Processors);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator(&local_371);
      cmXMLWriter::EndElement(local_18);
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"NamedMeasurement",&local_399);
      cmXMLWriter::StartElement(pcVar1,&local_398);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
      cmXMLWriter::Attribute<char[12]>(local_18,"type",(char (*) [12])"text/string");
      cmXMLWriter::Attribute<char[18]>(local_18,"name",(char (*) [18])"Completion Status");
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"Value",&local_3c1);
      cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_3c0,&local_190->CompletionStatus);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
      cmXMLWriter::EndElement(local_18);
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"NamedMeasurement",&local_3e9);
      cmXMLWriter::StartElement(pcVar1,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator(&local_3e9);
      cmXMLWriter::Attribute<char[12]>(local_18,"type",(char (*) [12])"text/string");
      cmXMLWriter::Attribute<char[13]>(local_18,"name",(char (*) [13])"Command Line");
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_410,"Value",(allocator<char> *)((long)&__range2 + 7));
      cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_410,&local_190->FullCommandLine);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      cmXMLWriter::EndElement(local_18);
      this_01 = &local_190->Properties->Measurements;
      __end2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(this_01);
      measure = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(this_01);
      while (bVar2 = std::operator!=(&__end2,(_Self *)&measure), pcVar1 = local_18, bVar2) {
        local_438 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator*(&__end2);
        pcVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,"NamedMeasurement",&local_459);
        cmXMLWriter::StartElement(pcVar1,&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator(&local_459);
        cmXMLWriter::Attribute<char[12]>(local_18,"type",(char (*) [12])"text/string");
        cmXMLWriter::Attribute<std::__cxx11::string>(local_18,"name",&local_438->first);
        pcVar1 = local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"Value",&local_481);
        cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_480,&local_438->second);
        std::__cxx11::string::~string((string *)&local_480);
        std::allocator<char>::~allocator(&local_481);
        cmXMLWriter::EndElement(local_18);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end2);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"Measurement",&local_4a9);
      cmXMLWriter::StartElement(pcVar1,&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator(&local_4a9);
      pcVar1 = local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"Value",&local_4d1);
      cmXMLWriter::StartElement(pcVar1,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::allocator<char>::~allocator(&local_4d1);
      if ((local_190->CompressOutput & 1U) != 0) {
        cmXMLWriter::Attribute<char[7]>(local_18,"encoding",(char (*) [7])"base64");
        cmXMLWriter::Attribute<char[5]>(local_18,"compression",(char (*) [5])0x8465eb);
      }
      cmXMLWriter::Content<std::__cxx11::string>(local_18,&local_190->Output);
      cmXMLWriter::EndElement(local_18);
      cmXMLWriter::EndElement(local_18);
      cmXMLWriter::EndElement(local_18);
      AttachFiles(this,local_18,local_190);
      WriteTestResultFooter(this,local_18,local_190);
      __gnu_cxx::
      __normal_iterator<cmCTestTestHandler::cmCTestTestResult_*,_std::vector<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>_>
      ::operator++(&__end1_1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f8,"EndDateTime",&local_4f9);
    cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_4f8,&this->EndTest);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,"EndTestTime",&local_521);
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (pcVar1,&local_520,&this->EndTestTime);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator(&local_521);
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_548,"ElapsedMinutes",&local_549);
    local_560.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<60l,1l>>,double,std::ratio<1l,1l>>
                        (&this->ElapsedTestingTime);
    local_558 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count(&local_560);
    cmXMLWriter::Element<long>(pcVar1,&local_548,&local_558);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    cmXMLWriter::EndElement(local_18);
    cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,local_18);
  }
  return;
}

Assistant:

void cmCTestTestHandler::GenerateDartOutput(cmXMLWriter& xml)
{
  if (!this->CTest->GetProduceXML()) {
    return;
  }

  this->CTest->StartXML(xml, this->AppendXML);
  this->CTest->GenerateSubprojectsOutput(xml);
  xml.StartElement("Testing");
  xml.Element("StartDateTime", this->StartTest);
  xml.Element("StartTestTime", this->StartTestTime);
  xml.StartElement("TestList");
  for (cmCTestTestResult const& result : this->TestResults) {
    std::string testPath = result.Path + "/" + result.Name;
    xml.Element("Test", this->CTest->GetShortPathToFile(testPath.c_str()));
  }
  xml.EndElement(); // TestList
  for (cmCTestTestResult& result : this->TestResults) {
    this->WriteTestResultHeader(xml, result);
    xml.StartElement("Results");

    if (result.Status != cmCTestTestHandler::NOT_RUN) {
      if (result.Status != cmCTestTestHandler::COMPLETED ||
          result.ReturnValue) {
        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", "Exit Code");
        xml.Element("Value", this->GetTestStatus(result));
        xml.EndElement(); // NamedMeasurement

        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", "Exit Value");
        xml.Element("Value", result.ReturnValue);
        xml.EndElement(); // NamedMeasurement
      }
      this->GenerateRegressionImages(xml, result.DartString);
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", "numeric/double");
      xml.Attribute("name", "Execution Time");
      xml.Element("Value", result.ExecutionTime.count());
      xml.EndElement(); // NamedMeasurement
      if (!result.Reason.empty()) {
        const char* reasonType = "Pass Reason";
        if (result.Status != cmCTestTestHandler::COMPLETED) {
          reasonType = "Fail Reason";
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", reasonType);
        xml.Element("Value", result.Reason);
        xml.EndElement(); // NamedMeasurement
      }
    }

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "numeric/double");
    xml.Attribute("name", "Processors");
    xml.Element("Value", result.Properties->Processors);
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Completion Status");
    xml.Element("Value", result.CompletionStatus);
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Command Line");
    xml.Element("Value", result.FullCommandLine);
    xml.EndElement(); // NamedMeasurement
    for (auto const& measure : result.Properties->Measurements) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", "text/string");
      xml.Attribute("name", measure.first);
      xml.Element("Value", measure.second);
      xml.EndElement(); // NamedMeasurement
    }
    xml.StartElement("Measurement");
    xml.StartElement("Value");
    if (result.CompressOutput) {
      xml.Attribute("encoding", "base64");
      xml.Attribute("compression", "gzip");
    }
    xml.Content(result.Output);
    xml.EndElement(); // Value
    xml.EndElement(); // Measurement
    xml.EndElement(); // Results

    this->AttachFiles(xml, result);
    this->WriteTestResultFooter(xml, result);
  }

  xml.Element("EndDateTime", this->EndTest);
  xml.Element("EndTestTime", this->EndTestTime);
  xml.Element(
    "ElapsedMinutes",
    std::chrono::duration_cast<std::chrono::minutes>(this->ElapsedTestingTime)
      .count());
  xml.EndElement(); // Testing
  this->CTest->EndXML(xml);
}